

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int getCoreTemp(void)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  float temp;
  char buffer [256];
  
  temp = 0.0;
  __stream = popen("/opt/vc/bin/vcgencmd measure_temp 2>&1","r");
  if (__stream == (FILE *)0x0) {
    iVar1 = -0x1e;
  }
  else {
    while( true ) {
      iVar1 = feof(__stream);
      if (iVar1 != 0) break;
      pcVar2 = fgets(buffer,0x100,__stream);
      if (pcVar2 != (char *)0x0) {
        __isoc99_sscanf(buffer,"temp=%f\'C",&temp);
      }
    }
    pclose(__stream);
    iVar1 = (int)temp + -0x1e;
  }
  return iVar1;
}

Assistant:

int getCoreTemp()
{
	float temp = 0.;
    FILE * stream;
    const int max_buffer = 256;
    char buffer[max_buffer];
    
    stream = popen("/opt/vc/bin/vcgencmd measure_temp 2>&1", "r");	
    if (stream) {
		while (!feof(stream))
			if (fgets(buffer, max_buffer, stream) != NULL) 
			{					
				sscanf(buffer, "temp=%f'C", &temp);				
			}
		pclose(stream);
    }
    return ((int)temp - 30);
}